

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIScrollBar::~CGUIScrollBar(CGUIScrollBar *this,void **vtt)

{
  void *pvVar1;
  IGUIButton *pIVar2;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[5];
  pIVar2 = this->UpButton;
  if (pIVar2 != (IGUIButton *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] +
               (long)&(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver));
  }
  pIVar2 = this->DownButton;
  if (pIVar2 != (IGUIButton *)0x0) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[-3] +
               (long)&(pIVar2->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver));
  }
  IGUIElement::~IGUIElement((IGUIElement *)this,vtt + 2);
  return;
}

Assistant:

CGUIScrollBar::~CGUIScrollBar()
{
	if (UpButton)
		UpButton->drop();

	if (DownButton)
		DownButton->drop();
}